

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

size_type __thiscall
QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
::copyIfNotEquivalentTo
          (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
           *this,Map *source,Key *key)

{
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_tools_qmap_h:60:29)>
  __pred;
  long in_FS_OFFSET;
  insert_iterator<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  __result;
  size_type result;
  key_compare local_31;
  size_type local_30;
  size_type *local_28;
  Key *pKStack_20;
  key_compare *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &local_30;
  local_30 = 0;
  local_18 = &local_31;
  __pred._M_pred.key = (Key *)key;
  __pred._M_pred.result = local_28;
  __pred._M_pred.keyCompare = local_18;
  __result.iter._M_node = &(this->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  __result.container = &this->m;
  pKStack_20 = key;
  std::
  __remove_copy_if<std::_Rb_tree_const_iterator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>,std::insert_iterator<std::map<int,QPointer<QAbstractItemDelegate>,std::less<int>,std::allocator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>>>,__gnu_cxx::__ops::_Iter_pred<QMapData<std::map<int,QPointer<QAbstractItemDelegate>,std::less<int>,std::allocator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>>>::copyIfNotEquivalentTo(std::map<int,QPointer<QAbstractItemDelegate>,std::less<int>,std::allocator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>>const&,int_const&)::_lambda(auto:1_const&)_1_>>
            ((source->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>)
             &(source->_M_t)._M_impl.super__Rb_tree_header,__result,__pred);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

size_type copyIfNotEquivalentTo(const Map &source, const Key &key)
    {
        Q_ASSERT(m.empty());

        size_type result = 0;
        const auto &keyCompare = source.key_comp();
        const auto filter = [&result, &key, &keyCompare](const auto &v)
        {
            if (!keyCompare(key, v.first) && !keyCompare(v.first, key)) {
                // keys are equivalent (neither a<b nor b<a) => found it
                ++result;
                return true;
            }
            return false;
        };

        std::remove_copy_if(source.cbegin(), source.cend(),
                            std::inserter(m, m.end()),
                            filter);
        return result;
    }